

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

void __thiscall
glcts::ViewportArray::DepthRangeAPI::compareDepthRanges<float>
          (DepthRangeAPI *this,vector<float,_std::allocator<float>_> *left,
          vector<float,_std::allocator<float>_> *right,GLchar *description,bool *out_result)

{
  float *pfVar1;
  size_t sVar2;
  pointer pfVar3;
  pointer pfVar4;
  ulong uVar5;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  pfVar3 = (left->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar4 = (left->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if (pfVar4 != pfVar3) {
    uVar5 = 0;
    do {
      pfVar1 = (right->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start + uVar5;
      if ((pfVar3[uVar5] != *pfVar1) || (NAN(pfVar3[uVar5]) || NAN(*pfVar1))) {
        local_1b0 = (undefined1  [8])((this->super_TestCaseBase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Test case: ",0xb);
        if (description == (GLchar *)0x0) {
          std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
        }
        else {
          sVar2 = strlen(description);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,description,sVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8," Invalid values [",0x11);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"] ",2);
        std::ostream::_M_insert<double>
                  ((double)(left->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar5]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
        std::ostream::_M_insert<double>
                  ((double)(right->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar5]);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        *out_result = false;
        pfVar3 = (left->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar4 = (left->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)pfVar4 - (long)pfVar3 >> 2));
  }
  return;
}

Assistant:

void DepthRangeAPI::compareDepthRanges(std::vector<T>& left, std::vector<T>& right, const GLchar* description,
									   bool& out_result)
{
	for (size_t i = 0; i < left.size(); ++i)
	{
		if (left[i] != right[i])
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << description
												<< " Invalid values [" << i << "] " << left[i] << " " << right[i]
												<< tcu::TestLog::EndMessage;
			out_result = false;
		}
	}
}